

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slacking.hpp
# Opt level: O0

Json __thiscall slack::_detail::Slacking::post(Slacking *this,string *method,Json *json)

{
  Json *in_RCX;
  json_value extraout_RDX;
  Json JVar1;
  allocator local_91;
  string local_90 [32];
  _detail local_70 [48];
  undefined1 local_40 [8];
  vector<slack::_detail::Element,_std::allocator<slack::_detail::Element>_> elements;
  Json *json_local;
  string *method_local;
  Slacking *this_local;
  
  json_to_elements((vector<slack::_detail::Element,_std::allocator<slack::_detail::Element>_> *)
                   local_40,in_RCX);
  std::vector<slack::_detail::Element,std::allocator<slack::_detail::Element>>::
  emplace_back<char_const(&)[6],std::__cxx11::string&>
            ((vector<slack::_detail::Element,std::allocator<slack::_detail::Element>> *)local_40,
             (char (*) [6])0x18e25b,method + 0xc0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_90,"&",&local_91);
  join<slack::_detail::Element>
            (local_70,(vector<slack::_detail::Element,_std::allocator<slack::_detail::Element>_> *)
                      local_40,(string *)local_90);
  post(this,method,(string *)json);
  std::__cxx11::string::~string((string *)local_70);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  std::vector<slack::_detail::Element,_std::allocator<slack::_detail::Element>_>::~vector
            ((vector<slack::_detail::Element,_std::allocator<slack::_detail::Element>_> *)local_40);
  JVar1.m_value.object = extraout_RDX.object;
  JVar1._0_8_ = this;
  return JVar1;
}

Assistant:

Json post(const std::string& method, const Json& json) {
        
        auto elements = json_to_elements(json);
        elements.emplace_back("token", token_);
        return post(method, join(elements));
    }